

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator *this_00;
  string_type local_a0;
  long local_80;
  size_type pos;
  reference local_68;
  path *fn;
  iterator iter;
  path *this_local;
  
  iter._current._path.field_2._8_8_ = this;
  bVar1 = has_relative_path(this);
  if (bVar1) {
    end((iterator *)&fn,this);
    this_00 = iterator::operator--((iterator *)&fn);
    local_68 = iterator::operator*(this_00);
    local_80 = std::__cxx11::string::rfind((char)local_68,0x2e);
    if ((local_80 == -1) || (local_80 == 0)) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_68);
      path(__return_storage_ptr__,&local_a0,native_format);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar1 = true;
    }
    iterator::~iterator((iterator *)&fn);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  path(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::extension() const
{
    if (has_relative_path()) {
        auto iter = end();
        const auto& fn = *--iter;
        impl_string_type::size_type pos = fn._path.rfind('.');
        if (pos != std::string::npos && pos > 0) {
            return path(fn._path.substr(pos), native_format);
        }
    }
    return path();
}